

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinFT98_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double rho_00;
  long lVar1;
  double sigma_00;
  double tau_00;
  double dVar2;
  double local_50;
  const_host_buffer_type local_48;
  const_host_buffer_type local_40;
  const_host_buffer_type local_38;
  
  if (0 < N) {
    lVar1 = 0;
    local_48 = sigma;
    local_40 = lapl;
    local_38 = tau;
    do {
      rho_00 = *(double *)((long)rho + lVar1);
      if (rho_00 <= 1e-12) {
        *(double *)(lVar1 + (long)eps) = 0.0;
        *(double *)((long)vrho + lVar1) = 0.0;
        *(double *)((long)vsigma + lVar1) = 0.0;
        local_50 = 0.0;
        *(double *)((long)vtau + lVar1) = 0.0;
      }
      else {
        dVar2 = 1.0000000000000042e-32;
        if (1.0000000000000042e-32 <= *(double *)((long)local_48 + lVar1)) {
          dVar2 = *(double *)((long)local_48 + lVar1);
        }
        tau_00 = 1e-20;
        if (1e-20 <= *(double *)((long)local_38 + lVar1)) {
          tau_00 = *(double *)((long)local_38 + lVar1);
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinFT98_X>::eval_exc_vxc_unpolar_impl
                  (rho_00,sigma_00,*(double *)((long)local_40 + lVar1),tau_00,
                   (double *)(lVar1 + (long)eps),(double *)((long)vrho + lVar1),
                   (double *)((long)vsigma + lVar1),&local_50,(double *)((long)vtau + lVar1));
      }
      *(double *)((long)vlapl + lVar1) = local_50;
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double vl;
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i],
      eps[i], vrho[i], vsigma[i], vl, vtau[i] );
    if(traits::needs_laplacian) vlapl[i] = vl;

  }

}